

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

QDateTime __thiscall QFileInfo::fileTime(QFileInfo *this,FileTime time,QTimeZone *tz)

{
  QFileInfoPrivate *this_00;
  QDateTime *other;
  undefined4 in_register_00000034;
  MetaDataFlags what;
  long in_FS_OFFSET;
  QDateTime dt;
  Data local_48;
  QDateTime local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileInfoPrivate **)CONCAT44(in_register_00000034,time);
  local_48.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::QDateTime(&local_40);
  if ((*(uint *)&this_00->field_0x1d8 >> 0x1e & 1) == 0) {
    if ((this_00->fileEngine)._M_t.
        super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
        super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
        super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
      super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
           ((uint)((FileTime)tz < 4) << 0x19);
      if ((-1 < (int)*(uint *)&this_00->field_0x1d8) ||
         (((uint)what.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
          ~(this_00->metaData).knownFlagsMask.
           super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i) != 0)) {
        QFileSystemEngine::fillMetaData(&this_00->fileEntry,&this_00->metaData,what);
      }
      QFileSystemMetaData::fileTime((QFileSystemMetaData *)&local_48.data,(int)this_00 + 0x40);
    }
    else {
      other = QFileInfoPrivate::getFileTime(this_00,(FileTime)tz);
      QDateTime::QDateTime((QDateTime *)&local_48.data,other);
    }
  }
  else {
    QDateTime::QDateTime((QDateTime *)&local_48.data,&local_40);
  }
  QDateTime::~QDateTime(&local_40);
  QDateTime::toTimeZone((QDateTime *)this,(QTimeZone *)&local_48.data);
  QDateTime::~QDateTime((QDateTime *)&local_48.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)(Data)this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QFileInfo::fileTime(QFile::FileTime time, const QTimeZone &tz) const
{
    Q_D(const QFileInfo);
    QFileSystemMetaData::MetaDataFlags flag;
    switch (time) {
    case QFile::FileAccessTime:
        flag = QFileSystemMetaData::AccessTime;
        break;
    case QFile::FileBirthTime:
        flag = QFileSystemMetaData::BirthTime;
        break;
    case QFile::FileMetadataChangeTime:
        flag = QFileSystemMetaData::MetadataChangeTime;
        break;
    case QFile::FileModificationTime:
        flag = QFileSystemMetaData::ModificationTime;
        break;
    }

    auto fsLambda = [d, time]() { return d->metaData.fileTime(time); };
    auto engineLambda = [d, time]() { return d->getFileTime(time); };
    const auto dt =
        d->checkAttribute<QDateTime>(flag, std::move(fsLambda), std::move(engineLambda));
    return dt.toTimeZone(tz);
}